

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BooPHF.h
# Opt level: O1

void __thiscall
boomphf::mphf<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>>::
mphf<std::vector<unsigned_long,std::allocator<unsigned_long>>>
          (mphf<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>> *this,size_t n,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *input_range,int num_thread,
          double gamma,bool writeEach,bool progress,float perc_elem_loaded)

{
  int iVar1;
  int iVar2;
  bitVector *this_00;
  undefined1 auVar3 [16];
  double dVar4;
  undefined8 *puVar5;
  void *pvVar6;
  uint64_t offset;
  long lVar7;
  ulong uVar8;
  EVP_PKEY_CTX *ctx;
  mphf<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>> *pmVar9;
  size_t __nmemb;
  long lVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x20) = 7;
  *(undefined8 *)(this + 0x78) = 0;
  puVar5 = &HashFunctors<unsigned_long>::generate_hash_seed()::rbase;
  pmVar9 = this + 0x28;
  for (lVar7 = 10; lVar7 != 0; lVar7 = lVar7 + -1) {
    *(undefined8 *)pmVar9 = *puVar5;
    puVar5 = puVar5 + 1;
    pmVar9 = pmVar9 + 8;
  }
  lVar7 = 8;
  uVar8 = 3;
  do {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar8;
    *(long *)(this + lVar7 * 8 + -0x18) =
         *(long *)(this + (SUB168(auVar3 * ZEXT816(0xcccccccccccccccd),8) * 2 & 0xfffffffffffffff0U)
                          * -5 + lVar7 * 8) * *(long *)(this + lVar7 * 8 + -0x18) +
         *(long *)(this + 0x78);
    lVar7 = lVar7 + 1;
    uVar8 = uVar8 + 1;
  } while (lVar7 != 0x12);
  *(double *)(this + 0x88) = gamma;
  auVar14._8_4_ = (int)(n >> 0x20);
  auVar14._0_8_ = n;
  auVar14._12_4_ = 0x45300000;
  dVar11 = ceil(((auVar14._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)n) - 4503599627370496.0)) * gamma);
  *(long *)(this + 0x90) =
       (long)(dVar11 - 9.223372036854776e+18) & (long)dVar11 >> 0x3f | (long)dVar11;
  *(size_t *)(this + 0x98) = n;
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_boomphf::SingleHashFunctor<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_boomphf::SingleHashFunctor<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)(this + 0xa0));
  *(undefined4 *)(this + 0x138) = 0;
  *(mphf<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>> **)(this + 0x160) = this + 0x170;
  *(undefined8 *)(this + 0x168) = 0;
  this[0x170] = (mphf<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>>)0x0;
  *(undefined8 *)(this + 0x1a8) = 0;
  *(undefined8 *)(this + 0x1b0) = 0;
  *(undefined8 *)(this + 0x1b8) = 0;
  *(undefined8 *)(this + 0x1c0) = 0;
  *(undefined8 *)(this + 0x1c8) = 0;
  *(undefined8 *)(this + 0x1d0) = 0;
  *(int *)(this + 0x1e4) = num_thread;
  *(float *)(this + 0x218) = perc_elem_loaded;
  *(undefined8 *)(this + 0x220) = 0;
  *(undefined8 *)(this + 0x228) = 0;
  *(undefined8 *)(this + 0x230) = 0;
  *(undefined8 *)(this + 0x238) = 0;
  *(undefined8 *)(this + 0x240) = 0;
  *(undefined8 *)(this + 0x248) = 0;
  this[0x254] = (mphf<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>>)progress;
  if (n == 0) {
    return;
  }
  this[0x21c] = (mphf<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>>)
                (0.0 < perc_elem_loaded);
  if (writeEach) {
    this[0x256] = (mphf<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>>)0x1;
    this[0x21c] = (mphf<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>>)0x0;
  }
  else {
    this[0x256] = (mphf<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>>)0x0;
  }
  mphf<unsigned_long,_boomphf::SingleHashFunctor<unsigned_long>_>::setup
            ((mphf<unsigned_long,_boomphf::SingleHashFunctor<unsigned_long>_> *)this);
  if (this[0x254] != (mphf<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>>)0x1)
  goto LAB_0010bc7b;
  *(undefined4 *)(this + 0x138) = 1;
  iVar1 = *(int *)(this + 0x18);
  dVar15 = 1.0 / (1.0 - *(double *)(this + 0x1f0)) + 1.0;
  iVar2 = *(int *)(this + 0x250);
  dVar11 = pow(*(double *)(this + 0x1f0),(double)iVar2);
  dVar11 = (double)(int)(~*(uint *)(this + 0x250) + *(int *)(this + 0x18)) * dVar11 +
           (double)(iVar2 + 1);
  printf("for info, total work write each  : %.3f    total work inram from level %i : %.3f  total work raw : %.3f \n"
         ,dVar15,SUB84(dVar11,0),(double)iVar1);
  if (writeEach) {
    auVar12._0_8_ = (double)CONCAT44(0x43300000,(int)*(undefined8 *)(this + 0x98));
    auVar12._8_4_ = (int)((ulong)*(undefined8 *)(this + 0x98) >> 0x20);
    auVar12._12_4_ = 0x45300000;
    dVar4 = (auVar12._8_8_ - 1.9342813113834067e+25) + (auVar12._0_8_ - 4503599627370496.0);
    dVar11 = dVar15;
LAB_0010bc3c:
    uVar8 = (ulong)(dVar11 * dVar4);
    ctx = (EVP_PKEY_CTX *)
          ((long)(dVar11 * dVar4 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f | uVar8);
  }
  else {
    lVar7 = *(long *)(this + 0x98);
    if (this[0x21c] == (mphf<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>>)0x1) {
      auVar13._8_4_ = (int)((ulong)lVar7 >> 0x20);
      auVar13._0_8_ = lVar7;
      auVar13._12_4_ = 0x45300000;
      dVar4 = (auVar13._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0);
      goto LAB_0010bc3c;
    }
    ctx = (EVP_PKEY_CTX *)(lVar7 * *(int *)(this + 0x18));
  }
  Progress::init((Progress *)(this + 0x138),ctx);
LAB_0010bc7b:
  if (*(int *)(this + 0x18) < 1) {
    offset = 0;
  }
  else {
    lVar10 = 0x10;
    lVar7 = 0;
    offset = 0;
    do {
      puVar5 = (undefined8 *)operator_new(0x30);
      uVar8 = *(ulong *)(*(long *)this + -8 + lVar10);
      puVar5[1] = uVar8;
      puVar5[3] = 0;
      puVar5[4] = 0;
      puVar5[5] = 0;
      __nmemb = (uVar8 >> 6) + 1;
      puVar5[2] = __nmemb;
      pvVar6 = calloc(__nmemb,8);
      *puVar5 = pvVar6;
      *(undefined8 **)(this + 0x80) = puVar5;
      processLevel<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                (this,input_range,(int)lVar7);
      bitVector::clearCollisions
                ((bitVector *)(*(long *)this + lVar10),0,*(size_t *)(*(long *)this + -8 + lVar10),
                 *(bitVector **)(this + 0x80));
      offset = bitVector::build_ranks((bitVector *)(*(long *)this + lVar10),offset);
      this_00 = *(bitVector **)(this + 0x80);
      if (this_00 != (bitVector *)0x0) {
        bitVector::~bitVector(this_00);
        operator_delete(this_00);
      }
      lVar7 = lVar7 + 1;
      lVar10 = lVar10 + 0x40;
    } while (lVar7 < *(int *)(this + 0x18));
  }
  if (this[0x254] != (mphf<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>>)0x0) {
    Progress::finish_threaded((Progress *)(this + 0x138));
  }
  *(uint64_t *)(this + 0x1f8) = offset;
  pvVar6 = *(void **)(this + 0x220);
  *(undefined8 *)(this + 0x220) = 0;
  *(undefined8 *)(this + 0x228) = 0;
  *(undefined8 *)(this + 0x230) = 0;
  if (pvVar6 != (void *)0x0) {
    operator_delete(pvVar6);
  }
  pthread_mutex_destroy((pthread_mutex_t *)(this + 0x268));
  this[0x255] = (mphf<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>>)0x1;
  return;
}

Assistant:

mphf( size_t n, Range const& input_range,int num_thread = 1,  double gamma = 2.0 , bool writeEach = true, bool progress =true, float perc_elem_loaded = 0.03) :
		_gamma(gamma), _hash_domain(size_t(ceil(double(n) * gamma))), _nelem(n), _num_thread(num_thread), _percent_elem_loaded_for_fastMode (perc_elem_loaded), _withprogress(progress)
		{
			if(n ==0) return;
			
			_fastmode = false;
			

			
			if(_percent_elem_loaded_for_fastMode > 0.0 )
				_fastmode =true;

			
			if(writeEach)
			{
				_writeEachLevel =true;
				_fastmode = false;
			}
			else
			{
				_writeEachLevel = false;
			}
			
			setup();

			if(_withprogress)
			{
				_progressBar.timer_mode=1;
				
				
				double total_raw = _nb_levels;
				
				double sum_geom_read =  ( 1.0 / (1.0 - _proba_collision));
				double total_writeEach = sum_geom_read + 1.0;

				double total_fastmode_ram =  (_fastModeLevel+1) +  ( pow(_proba_collision,_fastModeLevel)) * (_nb_levels-(_fastModeLevel+1))   ;
				
				printf("for info, total work write each  : %.3f    total work inram from level %i : %.3f  total work raw : %.3f \n",total_writeEach,_fastModeLevel,total_fastmode_ram,total_raw);

				if(writeEach)
				{
					_progressBar.init(_nelem * total_writeEach,"Building BooPHF",num_thread);
				}
				else if(_fastmode)
					_progressBar.init( _nelem * total_fastmode_ram    ,"Building BooPHF",num_thread);
				else
					_progressBar.init( _nelem * _nb_levels ,"Building BooPHF",num_thread);
			}

			uint64_t offset = 0;
			for(int ii = 0; ii< _nb_levels; ii++)
			{
				_tempBitset =  new bitVector(_levels[ii].hash_domain); // temp collision bitarray for this level

				processLevel(input_range,ii);

				_levels[ii].bitset.clearCollisions(0 , _levels[ii].hash_domain , _tempBitset);
				
				offset = _levels[ii].bitset.build_ranks(offset);

				delete _tempBitset;
			}

			if(_withprogress)
			_progressBar.finish_threaded();


			_lastbitsetrank = offset ;

			//printf("used temp ram for construction : %lli MB \n",setLevelFastmode.capacity()* sizeof(elem_t) /1024ULL/1024ULL);

			std::vector<elem_t>().swap(setLevelFastmode);   // clear setLevelFastmode reallocating


			pthread_mutex_destroy(&_mutex);
			
			_built = true;
		}